

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyAddStyleProperty(TidyDocImpl *doc,Node *node,ctmbstr property)

{
  AttVal *pAVar1;
  tmbstr ptVar2;
  tmbstr s;
  AttVal *av;
  ctmbstr property_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pAVar1 = prvTidyAttrGetById(node,TidyAttr_STYLE);
  if (pAVar1 == (AttVal *)0x0) {
    pAVar1 = prvTidyNewAttributeEx(doc,"style",property,0x22);
    prvTidyInsertAttributeAtStart(node,pAVar1);
  }
  else if (pAVar1->value == (tmbstr)0x0) {
    ptVar2 = prvTidytmbstrdup(doc->allocator,property);
    pAVar1->value = ptVar2;
  }
  else {
    ptVar2 = MergeProperties(doc,pAVar1->value,property);
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar1->value);
    pAVar1->value = ptVar2;
  }
  return;
}

Assistant:

void TY_(AddStyleProperty)(TidyDocImpl* doc, Node *node, ctmbstr property )
{
    AttVal *av = TY_(AttrGetById)(node, TidyAttr_STYLE);

    /* if style attribute already exists then insert property */

    if ( av )
    {
        if (av->value != NULL)
        {
            tmbstr s = MergeProperties( doc, av->value, property );
            TidyDocFree( doc, av->value );
            av->value = s;
        }
        else
        {
            av->value = TY_(tmbstrdup)( doc->allocator, property );
        }
    }
    else /* else create new style attribute */
    {
        av = TY_(NewAttributeEx)( doc, "style", property, '"' );
        TY_(InsertAttributeAtStart)( node, av );
    }
}